

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

Stmt * __thiscall parser::Parser::parseStatement(Parser *this)

{
  FunctionStmt *pFVar1;
  ForRangeStmt *pFVar2;
  DeclareStmt *pDVar3;
  ReturnStmt *pRVar4;
  InitStmt *pIVar5;
  IfStmt *pIVar6;
  ExpressionStmt *pEVar7;
  Expr *pEVar8;
  Token TStack_40;
  
  switch((this->curToken).Type) {
  case DEFINE:
    if ((this->peekToken).Type != LBRACE) {
      pFVar1 = parseFunctionStatement(this);
      return (Stmt *)pFVar1;
    }
    break;
  case INIT:
    pIVar5 = parseInitStatement(this);
    return &pIVar5->super_Stmt;
  case DECLARE:
    pDVar3 = parseDeclStatement(this);
    return &pDVar3->super_Stmt;
  case FUNCTION:
  case EOB:
  case INVALID:
  case LBRACE:
  case RBRACE:
  case LPAREN:
  case RPAREN:
  case ELSE:
    pEVar7 = parseExpressionStatement(this);
    return &pEVar7->super_Stmt;
  case NEWLINE:
    return (Stmt *)0x0;
  case IF:
    pIVar6 = parseIfStatement(this);
    return &pIVar6->super_Stmt;
  case FOR:
    pFVar2 = parseForIntRangeStatement(this);
    return &pFVar2->super_Stmt;
  case RETURN:
    pRVar4 = parseReturnStatement(this);
    return &pRVar4->super_Stmt;
  }
  pEVar7 = (ExpressionStmt *)operator_new(0x48);
  token::Token::Token(&TStack_40,&this->curToken);
  ast::ExpressionStmt::ExpressionStmt(pEVar7,&TStack_40,this->l->line);
  token::Token::~Token(&TStack_40);
  pEVar8 = parseExpression(this);
  pEVar7->Expression = pEVar8;
  if (pEVar8 == (Expr *)0x0) {
    (*(pEVar7->super_Stmt).super_Node._vptr_Node[1])(pEVar7);
    pEVar7 = (ExpressionStmt *)0x0;
  }
  return &pEVar7->super_Stmt;
}

Assistant:

Stmt* Parser::parseStatement()
{
    switch (curToken.Type) {
       case TokenType::IF:
           return parseIfStatement();
       case TokenType::FOR:
           return parseForIntRangeStatement();
       case TokenType::DECLARE:
           return parseDeclStatement();
       case TokenType::INIT:
           return parseInitStatement();
       case TokenType::DEFINE:
           if(peekTokenIs(TokenType::LBRACE)){
               return parseExpressionStatement();
           }
           return parseFunctionStatement();
       case TokenType::RETURN:
            return parseReturnStatement();
       case TokenType::NEWLINE:
             return nullptr;
       default:
           return parseExpressionStatement();
    }
}